

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O3

void __thiscall tetgenmesh::outfaces(tetgenmesh *this,tetgenio *out)

{
  uint uVar1;
  memorypool *pmVar2;
  void **ppvVar3;
  tetrahedron ppdVar4;
  tetrahedron ppdVar5;
  tetrahedron ppdVar6;
  tetrahedron ppdVar7;
  tetrahedron ppdVar8;
  tetgenio *ptVar9;
  int *piVar10;
  tetrahedron *pppdVar11;
  tetgenbehavior *ptVar12;
  size_t sVar13;
  FILE *pFVar14;
  int iVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  ulong uVar23;
  uint uVar24;
  ulong uVar25;
  point pp [3];
  char facefilename [1024];
  uint local_4b0;
  uint local_49c;
  uint local_498;
  int *local_490;
  int local_478;
  int local_474;
  long local_468 [4];
  int *local_448;
  int *local_440;
  char local_438 [4];
  undefined2 auStack_434 [514];
  
  local_468[0] = 0;
  local_468[1] = 0;
  local_468[2] = 0;
  ptVar12 = this->b;
  if (out == (tetgenio *)0x0) {
    strcpy(local_438,ptVar12->outfilename);
    sVar13 = strlen(local_438);
    builtin_strncpy(local_438 + sVar13,".fac",4);
    *(undefined2 *)((long)auStack_434 + sVar13) = 0x65;
    if (ptVar12->quiet == 0) {
      printf("Writing %s.\n",local_438);
    }
  }
  else if (ptVar12->quiet == 0) {
    puts("Writing faces.");
  }
  lVar17 = this->tetrahedrons->items - this->hullsize;
  uVar23 = (this->hullsize + lVar17 * 4) / 2;
  if (out == (tetgenio *)0x0) {
    pFVar14 = fopen(local_438,"w");
    if (pFVar14 == (FILE *)0x0) {
      printf("File I/O Error:  Cannot create file %s.\n",local_438);
      puts("Error:  Out of memory.");
      exit(1);
    }
    local_448 = (int *)0x0;
    fprintf(pFVar14,"%ld  %d\n",uVar23,(ulong)(this->b->nobound == 0));
    ptVar12 = this->b;
    local_440 = (int *)0x0;
  }
  else {
    uVar25 = uVar23 * 4;
    uVar22 = 0xffffffffffffffff;
    if (uVar23 * 3 < 0x4000000000000000) {
      uVar22 = uVar23 * 0xc;
    }
    local_440 = (int *)operator_new__(uVar22);
    out->trifacelist = local_440;
    ptVar12 = this->b;
    if (ptVar12->order == 2) {
      piVar10 = (int *)operator_new__(uVar22);
      out->o2facelist = piVar10;
    }
    if (ptVar12->nobound == 0) {
      if (0x3fffffffffffffff < uVar23) {
        uVar25 = 0xffffffffffffffff;
      }
      piVar10 = (int *)operator_new__(uVar25);
      out->trifacemarkerlist = piVar10;
    }
    if (1 < ptVar12->neighout) {
      piVar10 = (int *)operator_new__(-(ulong)((uVar23 & 0x6000000000000000) != 0) | uVar23 * 8);
      out->face2tetlist = piVar10;
    }
    out->numberoftrifaces = (int)uVar23;
    local_448 = out->trifacemarkerlist;
    pFVar14 = (FILE *)0x0;
  }
  if (ptVar12->neighout < 2) {
    local_490 = (int *)0x0;
  }
  else {
    uVar23 = 0xffffffffffffffff;
    if ((ulong)(lVar17 * 4) < 0x4000000000000000) {
      uVar23 = lVar17 * 0x10;
    }
    local_490 = (int *)operator_new__(uVar23);
  }
  pmVar2 = this->tetrahedrons;
  uVar1 = this->in->firstnumber;
  uVar18 = 0;
  if (ptVar12->zeroindex == 0) {
    uVar18 = uVar1;
  }
  ppvVar3 = pmVar2->firstblock;
  pmVar2->pathblock = ppvVar3;
  pmVar2->pathitem =
       (void *)((long)ppvVar3 +
               (((long)pmVar2->alignbytes + 8U) -
               (ulong)(ppvVar3 + 1) % (ulong)(long)pmVar2->alignbytes));
  pmVar2->pathitemsleft = pmVar2->itemsperblock;
  pppdVar11 = tetrahedrontraverse(this);
  if (pppdVar11 != (tetrahedron *)0x0) {
    uVar1 = (uint)(uVar1 == 1 && uVar18 == 0);
    local_478 = 0;
    local_474 = 0;
    local_4b0 = 0;
    local_49c = 0;
    local_498 = 0;
    uVar24 = uVar18;
    do {
      lVar19 = 0;
      do {
        uVar23 = (ulong)pppdVar11[lVar19] & 0xfffffffffffffff0;
        uVar16 = fsymtbl[lVar19][(uint)pppdVar11[lVar19] & 0xf];
        ppdVar4 = *(tetrahedron *)(uVar23 + 0x38);
        ppdVar5 = (tetrahedron)this->dummypoint;
        if ((ppdVar4 == ppdVar5) || (*(int *)(pppdVar11 + 10) < *(int *)(uVar23 + 0x50))) {
          ptVar12 = this->b;
          if (ptVar12->order == 2) {
            ppdVar6 = pppdVar11[0xb];
            lVar20 = 0;
            lVar21 = lVar19;
            do {
              lVar21 = (long)enexttbl[lVar21];
              local_468[lVar20] = (long)ppdVar6[ver2edge[lVar21]];
              lVar20 = lVar20 + 1;
            } while (lVar20 != 3);
          }
          if (ptVar12->nobound == 0) {
            if ((ptVar12->plc == 0) && (ptVar12->refine == 0)) {
              local_4b0 = (uint)(ppdVar4 == ppdVar5);
            }
            else {
              local_4b0 = 0;
              if ((pppdVar11[9] != (tetrahedron)0x0) &&
                 (uVar25 = (ulong)pppdVar11[9][lVar19] & 0xfffffffffffffff8, uVar25 != 0)) {
                local_4b0 = *(uint *)(uVar25 + (long)this->shmarkindex * 4);
              }
            }
          }
          ppdVar6 = pppdVar11[orgpivot[lVar19]];
          ppdVar7 = pppdVar11[destpivot[lVar19]];
          ppdVar8 = pppdVar11[apexpivot[lVar19]];
          if (1 < ptVar12->neighout) {
            if (pppdVar11[7] == ppdVar5) {
              local_498 = 0xffffffff;
            }
            else {
              local_498 = *(uint *)(pppdVar11 + 10);
            }
            if (ppdVar4 == ppdVar5) {
              iVar15 = (int)lVar19 + (*(int *)(pppdVar11 + 10) - uVar18) * 4;
              local_49c = 0xffffffff;
            }
            else {
              local_49c = *(uint *)(uVar23 + 0x50);
              local_490[(int)((int)lVar19 + (*(int *)(pppdVar11 + 10) - uVar18) * 4)] = uVar24;
              iVar15 = (uVar16 & 3) + (local_49c - uVar18) * 4;
            }
            local_490[iVar15] = uVar24;
          }
          lVar21 = (long)this->pointmarkindex;
          uVar16 = *(int *)((long)ppdVar6 + lVar21 * 4) - uVar1;
          if (out == (tetgenio *)0x0) {
            fprintf(pFVar14,"%5d   %4d  %4d  %4d",(ulong)uVar24,(ulong)uVar16,
                    (ulong)(*(int *)((long)ppdVar7 + lVar21 * 4) - uVar1));
            ptVar12 = this->b;
            if (ptVar12->order == 2) {
              lVar21 = (long)this->pointmarkindex;
              fprintf(pFVar14,"  %4d  %4d  %4d",(ulong)(*(int *)(local_468[0] + lVar21 * 4) - uVar1)
                      ,(ulong)(*(int *)(local_468[1] + lVar21 * 4) - uVar1),
                      (ulong)(*(int *)(local_468[2] + lVar21 * 4) - uVar1));
              ptVar12 = this->b;
            }
            if (ptVar12->nobound == 0) {
              fprintf(pFVar14,"  %d",(ulong)local_4b0);
              ptVar12 = this->b;
            }
            if (1 < ptVar12->neighout) {
              fprintf(pFVar14,"    %5d  %5d",(ulong)local_498,(ulong)local_49c);
            }
            fputc(10,pFVar14);
          }
          else {
            lVar20 = (long)local_474;
            local_440[lVar20] = uVar16;
            local_440[lVar20 + 1] = *(int *)((long)ppdVar7 + lVar21 * 4) - uVar1;
            local_440[lVar20 + 2] = *(int *)((long)ppdVar8 + lVar21 * 4) - uVar1;
            if (ptVar12->order == 2) {
              piVar10 = out->o2facelist;
              lVar20 = (long)local_478;
              piVar10[lVar20] = *(int *)(local_468[0] + lVar21 * 4) - uVar1;
              piVar10[lVar20 + 1] = *(int *)(local_468[1] + (long)this->pointmarkindex * 4) - uVar1;
              local_478 = local_478 + 3;
              piVar10[lVar20 + 2] = *(int *)(local_468[2] + (long)this->pointmarkindex * 4) - uVar1;
            }
            if (ptVar12->nobound == 0) {
              local_448[(long)(int)uVar24 - (long)this->in->firstnumber] = local_4b0;
            }
            local_474 = local_474 + 3;
            if (1 < ptVar12->neighout) {
              piVar10 = out->face2tetlist;
              ptVar9 = this->in;
              piVar10[((long)(int)uVar24 - (long)ptVar9->firstnumber) * 2] = local_498;
              piVar10[((long)(int)uVar24 - (long)ptVar9->firstnumber) * 2 + 1] = local_49c;
            }
          }
          uVar24 = uVar24 + 1;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != 4);
      pppdVar11 = tetrahedrontraverse(this);
    } while (pppdVar11 != (tetrahedron *)0x0);
  }
  ptVar12 = this->b;
  if (out == (tetgenio *)0x0) {
    fprintf(pFVar14,"# Generated by %s\n",ptVar12->commandline);
    fclose(pFVar14);
    ptVar12 = this->b;
    if (1 < ptVar12->neighout) {
      strcpy(local_438,ptVar12->outfilename);
      sVar13 = strlen(local_438);
      builtin_strncpy(local_438 + sVar13,".t2f",4);
      *(undefined1 *)((long)auStack_434 + sVar13) = 0;
      if (ptVar12->quiet == 0) {
        printf("Writing %s.\n",local_438);
      }
      pFVar14 = fopen(local_438,"w");
      if (lVar17 < 1) {
        fclose(pFVar14);
        if (local_490 == (int *)0x0) {
          return;
        }
      }
      else {
        piVar10 = local_490 + 3;
        lVar19 = 0;
        do {
          fprintf(pFVar14,"%4d  %d %d %d %d\n",(ulong)(uint)(this->in->firstnumber + (int)lVar19),
                  (ulong)(uint)piVar10[-3],(ulong)(uint)piVar10[-2],(ulong)(uint)piVar10[-1],
                  *piVar10);
          lVar19 = lVar19 + 1;
          piVar10 = piVar10 + 4;
        } while (lVar17 != lVar19);
        fclose(pFVar14);
      }
      operator_delete__(local_490);
    }
  }
  else if (1 < ptVar12->neighout) {
    if (ptVar12->quiet == 0) {
      puts("Writing tetrahedron-to-face map.");
    }
    out->tet2facelist = local_490;
  }
  return;
}

Assistant:

void tetgenmesh::outfaces(tetgenio* out)
{
  FILE *outfile = NULL;
  char facefilename[FILENAMESIZE];
  triface tface, tsymface;
  face checkmark;
  point torg, tdest, tapex;
  long ntets, faces;
  int *elist = NULL, *emlist = NULL;
  int neigh1 = 0, neigh2 = 0;
  int marker = 0;
  int firstindex, shift;
  int facenumber;
  int index = 0;

  // For -o2 option.
  triface workface;
  point *extralist, pp[3] = {0,0,0}; 
  int highorderindex = 11; 
  int o2index = 0, i;

  // For -nn option.
  int *tet2facelist = NULL;
  int tidx; 

  if (out == (tetgenio *) NULL) {
    strcpy(facefilename, b->outfilename);
    strcat(facefilename, ".face");
  }

  if (!b->quiet) {
    if (out == (tetgenio *) NULL) {
      printf("Writing %s.\n", facefilename);
    } else {
      printf("Writing faces.\n");
    }
  }

  ntets = tetrahedrons->items - hullsize;
  faces = (ntets * 4l + hullsize) / 2l;

  if (out == (tetgenio *) NULL) {
    outfile = fopen(facefilename, "w");
    if (outfile == (FILE *) NULL) {
      printf("File I/O Error:  Cannot create file %s.\n", facefilename);
      terminatetetgen(this, 1);
    }
    fprintf(outfile, "%ld  %d\n", faces, !b->nobound);
  } else {
    // Allocate memory for 'trifacelist'.
    out->trifacelist = new int[faces * 3];
    if (out->trifacelist == (int *) NULL) {
      printf("Error:  Out of memory.\n");
      terminatetetgen(this, 1);
    }
    if (b->order == 2) {
      out->o2facelist = new int[faces * 3];
    }
    // Allocate memory for 'trifacemarkerlist' if necessary.
    if (!b->nobound) {
      out->trifacemarkerlist = new int[faces];
      if (out->trifacemarkerlist == (int *) NULL) {
        printf("Error:  Out of memory.\n");
        terminatetetgen(this, 1);
      }
    }
    if (b->neighout > 1) {
      // '-nn' switch.
      out->face2tetlist = new int[faces * 2];
      if (out->face2tetlist == (int *) NULL) {
        printf("Error:  Out of memory.\n");
        terminatetetgen(this, 1);
      }
    }
    out->numberoftrifaces = faces;
    elist = out->trifacelist;
    emlist = out->trifacemarkerlist;
  }

  if (b->neighout > 1) { // -nn option
    // Output the tetrahedron-to-face map.
    tet2facelist = new int[ntets * 4];
  }

  // Determine the first index (0 or 1).
  firstindex = b->zeroindex ? 0 : in->firstnumber;
  shift = 0; // Default no shiftment.
  if ((in->firstnumber == 1) && (firstindex == 0)) {
    shift = 1; // Shift the output indices by 1.
  }

  tetrahedrons->traversalinit();
  tface.tet = tetrahedrontraverse();
  facenumber = firstindex; // in->firstnumber;
  // To loop over the set of faces, loop over all tetrahedra, and look at
  //   the four faces of each one. If its adjacent tet is a hull tet,
  //   operate on the face, otherwise, operate on the face only if the
  //   current tet has a smaller index than its neighbor.
  while (tface.tet != (tetrahedron *) NULL) {
    for (tface.ver = 0; tface.ver < 4; tface.ver ++) {
      fsym(tface, tsymface);
      if (ishulltet(tsymface) || 
          (elemindex(tface.tet) < elemindex(tsymface.tet))) {
        torg = org(tface);
        tdest = dest(tface);
        tapex = apex(tface);
        if (b->order == 2) { // -o2
          // Get the three extra vertices on edges.
          extralist = (point *) (tface.tet[highorderindex]);
          // The extra vertices are on edges opposite the corners.
          enext(tface, workface);
          for (i = 0; i < 3; i++) {
            pp[i] = extralist[ver2edge[workface.ver]];
            enextself(workface);
          }
        }
        if (!b->nobound) {
          // Get the boundary marker of this face.
          if (b->plc || b->refine) { 
            // Shell face is used.
            tspivot(tface, checkmark);
            if (checkmark.sh == NULL) {
              marker = 0;  // It is an inner face. It's marker is 0.
            } else {
              marker = shellmark(checkmark);
            }
          } else {
            // Shell face is not used, only distinguish outer and inner face.
            marker = (int) ishulltet(tsymface);
          }
        }
        if (b->neighout > 1) {
          // '-nn' switch. Output adjacent tets indices.
          if (!ishulltet(tface)) {
            neigh1 = elemindex(tface.tet);
          } else {
            neigh1 = -1;
          }
          if (!ishulltet(tsymface)) {
            neigh2 = elemindex(tsymface.tet);
          } else {
            neigh2 = -1;  
          }
		  // Fill the tetrahedron-to-face map.
		  tidx = elemindex(tface.tet) - firstindex;
		  tet2facelist[tidx * 4 + tface.ver] = facenumber;
		  if (!ishulltet(tsymface)) {
		    tidx = elemindex(tsymface.tet) - firstindex;
			tet2facelist[tidx * 4 + (tsymface.ver & 3)] = facenumber;
		  }
        }
        if (out == (tetgenio *) NULL) {
          // Face number, indices of three vertices.
          fprintf(outfile, "%5d   %4d  %4d  %4d", facenumber,
                  pointmark(torg) - shift, pointmark(tdest) - shift,
                  pointmark(tapex) - shift);
          if (b->order == 2) { // -o2
            fprintf(outfile, "  %4d  %4d  %4d", pointmark(pp[0]) - shift, 
                    pointmark(pp[1]) - shift, pointmark(pp[2]) - shift);
          }
          if (!b->nobound) {
            // Output a boundary marker.
            fprintf(outfile, "  %d", marker);
          }
          if (b->neighout > 1) {
            fprintf(outfile, "    %5d  %5d", neigh1, neigh2);
          }
          fprintf(outfile, "\n");
        } else {
          // Output indices of three vertices.
          elist[index++] = pointmark(torg) - shift;
          elist[index++] = pointmark(tdest) - shift;
          elist[index++] = pointmark(tapex) - shift;
          if (b->order == 2) { // -o2
            out->o2facelist[o2index++] = pointmark(pp[0]) - shift;
            out->o2facelist[o2index++] = pointmark(pp[1]) - shift;
            out->o2facelist[o2index++] = pointmark(pp[2]) - shift;
          }
          if (!b->nobound) {
            emlist[facenumber - in->firstnumber] = marker;
          }
          if (b->neighout > 1) {
            out->face2tetlist[(facenumber - in->firstnumber) * 2]     = neigh1;
            out->face2tetlist[(facenumber - in->firstnumber) * 2 + 1] = neigh2;
          }
        }
        facenumber++;
      }
    }
    tface.tet = tetrahedrontraverse();
  }

  if (out == (tetgenio *) NULL) {
    fprintf(outfile, "# Generated by %s\n", b->commandline);
    fclose(outfile);
  }

  if (b->neighout > 1) { // -nn option
    // Output the tetrahedron-to-face map.
	if (out == (tetgenio *) NULL) {
	  strcpy(facefilename, b->outfilename);
      strcat(facefilename, ".t2f");
    }
	if (!b->quiet) {
      if (out == (tetgenio *) NULL) {
        printf("Writing %s.\n", facefilename);
      } else {
        printf("Writing tetrahedron-to-face map.\n");
      }
    }
	if (out == (tetgenio *) NULL) {
      outfile = fopen(facefilename, "w");
      for (tidx = 0; tidx < ntets; tidx++) {
        index = tidx * 4;
        fprintf(outfile, "%4d  %d %d %d %d\n", tidx + in->firstnumber,
                tet2facelist[index], tet2facelist[index+1], 
                tet2facelist[index+2], tet2facelist[index+3]);
      }
      fclose(outfile);
      delete [] tet2facelist;
    } else {
	  // Simply copy the address of the list to the output.
      out->tet2facelist = tet2facelist;
    }
  }
}